

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::integrate
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *q)

{
  int iVar1;
  double *q_00;
  size_t num_outputs;
  vector<double,_std::allocator<double>_> *q_local;
  TasmanianSparseGrid *this_local;
  
  iVar1 = getNumOutputs(this);
  ::std::vector<double,_std::allocator<double>_>::resize(q,(long)iVar1);
  q_00 = ::std::vector<double,_std::allocator<double>_>::data(q);
  integrate(this,q_00);
  return;
}

Assistant:

void TasmanianSparseGrid::integrate(std::vector<double> &q) const{
    size_t num_outputs = getNumOutputs();
    q.resize(num_outputs);
    integrate(q.data());
}